

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O0

void point_based_start(void)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int local_14;
  wchar_t i;
  char *prompt;
  
  Term_clear();
  display_player_xtra_info(L'\0');
  display_player_stat_info();
  iVar1 = Term->hgt;
  iVar2 = Term->wid;
  sVar3 = strlen("[up/down to move, left/right to modify, \'r\' to reset, \'Enter\' to accept]");
  prt("[up/down to move, left/right to modify, \'r\' to reset, \'Enter\' to accept]",
      iVar1 + L'\xffffffff',iVar2 / 2 - (int)(sVar3 >> 1));
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    buysell[local_14] = 0;
  }
  event_add_handler(EVENT_BIRTHPOINTS,point_based_points,(void *)0x0);
  event_add_handler(EVENT_STATS,point_based_stats,(void *)0x0);
  event_add_handler(EVENT_GOLD,point_based_misc,(void *)0x0);
  return;
}

Assistant:

static void point_based_start(void)
{
	const char *prompt = "[up/down to move, left/right to modify, 'r' to reset, 'Enter' to accept]";
	int i;

	/* Clear */
	Term_clear();

	/* Display the player */
	display_player_xtra_info(0);
	display_player_stat_info();

	prt(prompt, Term->hgt - 1, Term->wid / 2 - strlen(prompt) / 2);

	for (i = 0; i < STAT_MAX; ++i) {
		buysell[i] = 0;
	}

	/* Register handlers for various events - cheat a bit because we redraw
	   the lot at once rather than each bit at a time. */
	event_add_handler(EVENT_BIRTHPOINTS, point_based_points, NULL);	
	event_add_handler(EVENT_STATS, point_based_stats, NULL);	
	event_add_handler(EVENT_GOLD, point_based_misc, NULL);	
}